

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

Result __thiscall
tonk::Connection::InitializeOutgoingConnection
          (Connection *this,Dependencies *deps,TonkSocketConfig *socketConfig,
          TonkConnectionConfig *connectionConfig,char *serverHostname,uint16_t serverPort)

{
  atomic<int> *paVar1;
  _Atomic_word *p_Var2;
  in6_addr *this_00;
  ostringstream *poVar3;
  io_context *piVar4;
  ConnectionAddrMap *pCVar5;
  HostnameResolverState *__ptr;
  long *plVar6;
  long lVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined8 uVar10;
  _func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *p_Var11;
  undefined8 uVar12;
  RefCounter *pRVar13;
  IUDPSender *pIVar14;
  ConnectionIdMap *pCVar15;
  ConnectionIdMap *pCVar16;
  P2PConnectionKeyMap *pPVar17;
  MappedPortLifetime *pMVar18;
  bool bVar19;
  int iVar20;
  ConnectionAddrMap *pCVar21;
  undefined8 *puVar22;
  basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this_01;
  _func_int **pp_Var23;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
  *prVar24;
  error_category *peVar25;
  OutputWorker *pOVar26;
  thread_info_base *this_thread;
  undefined6 in_register_0000008a;
  uint16_t *puVar27;
  resolver_service_base *this_02;
  long in_FS_OFFSET;
  uint16_t in_stack_00000008;
  uint8_t keyBytes [8];
  allocator local_399;
  weak_cancel_token_type *local_398;
  io_context_impl *local_390;
  shared_ptr<asio::io_context> *local_388;
  anon_class_8_1_8991fb9c local_380;
  ptr local_378;
  undefined1 local_360 [32];
  undefined1 local_340 [16];
  ErrorResult local_330 [2];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [32];
  WindowHeader *pWStack_198;
  WindowHeader *pWStack_190;
  _Alloc_hider local_188;
  WindowHeader *local_180;
  undefined1 local_178 [24];
  WindowHeader *local_160;
  undefined1 local_158 [296];
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  pRVar13 = *(RefCounter **)socketConfig;
  pIVar14 = (IUDPSender *)socketConfig->AppContextPtr;
  pCVar21 = *(ConnectionAddrMap **)&socketConfig->WorkerCount;
  pCVar15 = *(ConnectionIdMap **)&socketConfig->UDPRecvBufferSizeBytes;
  pCVar16 = *(ConnectionIdMap **)&socketConfig->UDPRecvBufferSizeBytes;
  pPVar17 = *(P2PConnectionKeyMap **)&socketConfig->MaximumClients;
  pMVar18 = *(MappedPortLifetime **)&socketConfig->MinuteFloodThresh;
  deps[1].AddressMap = *(ConnectionAddrMap **)&socketConfig->WorkerCount;
  deps[1].IdMap = pCVar16;
  deps[1].P2PKeyMap = pPVar17;
  deps[1].MappedPort = pMVar18;
  deps[1].SocketRefCount = pRVar13;
  deps[1].UDPSender = pIVar14;
  deps[1].AddressMap = pCVar21;
  deps[1].IdMap = pCVar15;
  deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&socketConfig->NoDataTimeoutUsec;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&socketConfig->ConnectionTimeoutUsec);
  deps[1].DisconnectHandler = (FloodDetector *)socketConfig->InterfaceAddress;
  uVar10 = *(undefined8 *)&socketConfig->BandwidthLimitBPS;
  p_Var11 = socketConfig->OnIncomingConnection;
  uVar12 = *(undefined8 *)((long)&socketConfig->OnP2PConnectionStart + 4);
  *(undefined8 *)((long)&deps[1].DisconnectAddrKey.impl_.data_ + 0xc) =
       *(undefined8 *)((long)&socketConfig->OnIncomingConnection + 4);
  *(undefined8 *)((long)&deps[1].DisconnectAddrKey.impl_.data_ + 0x14) = uVar12;
  *(undefined8 *)&deps[1].DisconnectAddrKey.impl_.data_ = uVar10;
  *(_func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr **)
   ((long)&deps[1].DisconnectAddrKey.impl_.data_ + 8) = p_Var11;
  deps[1].NATPool = (INATPortPool *)socketConfig->SendToAppContextPtr;
  deps[2].SocketRefCount = (RefCounter *)connectionConfig;
  pCVar21 = *(ConnectionAddrMap **)(serverHostname + 8);
  pCVar15 = *(ConnectionIdMap **)(serverHostname + 0x10);
  pPVar17 = *(P2PConnectionKeyMap **)(serverHostname + 0x18);
  deps[2].UDPSender = *(IUDPSender **)serverHostname;
  deps[2].AddressMap = pCVar21;
  deps[2].IdMap = pCVar15;
  deps[2].P2PKeyMap = pPVar17;
  deps[2].MappedPort = *(MappedPortLifetime **)(serverHostname + 0x20);
  LOCK();
  paVar1 = &(deps[1].SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_388 = &deps[2].Context;
  std::__cxx11::string::string
            ((string *)local_1b8,(char *)CONCAT62(in_register_0000008a,serverPort),
             (allocator *)local_360);
  GetConnectionLogPrefix((string *)local_340,(string *)local_1b8,in_stack_00000008);
  logger::Channel::SetPrefix((Channel *)&deps[2].Context,(string *)local_340);
  if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_);
  }
  if ((__pthread_internal_list *)local_1b8._0_8_ != (__pthread_internal_list *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_);
  }
  piVar4 = deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar21 = (ConnectionAddrMap *)operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (pCVar21 != (ConnectionAddrMap *)0x0) {
    asio::io_context::strand::strand((strand *)pCVar21,piVar4);
  }
  pCVar5 = deps[0x1ca].AddressMap;
  deps[0x1ca].AddressMap = pCVar21;
  if (pCVar5 != (ConnectionAddrMap *)0x0) {
    operator_delete(pCVar5);
    pCVar21 = deps[0x1ca].AddressMap;
  }
  if (pCVar21 == (ConnectionAddrMap *)0x0) {
    local_1b8._8_8_ = (__pthread_internal_list *)0x0;
    local_1b8[0x10] = '\0';
    local_1b8._0_8_ = (__pthread_internal_list *)(local_1b8 + 0x10);
    pp_Var23 = (_func_int **)operator_new(0x38);
    *pp_Var23 = (_func_int *)"Out of memory";
    pp_Var23[1] = (_func_int *)(pp_Var23 + 3);
    pp_Var23[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var23 + 3) = 0;
    *(undefined4 *)(pp_Var23 + 5) = 0;
    pp_Var23[6] = (_func_int *)0x10;
    local_340._0_8_ = (ErrorResult *)0x0;
    (this->super_IConnection)._vptr_IConnection = pp_Var23;
    Result::~Result((Result *)local_340);
  }
  else {
    puVar22 = (undefined8 *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    if (puVar22 != (undefined8 *)0x0) {
      puVar22[2] = 0;
      puVar22[3] = 0;
      puVar22[4] = 0;
      puVar22[5] = 0;
      *puVar22 = 0;
      puVar22[1] = 0;
      puVar22[2] = 0;
      puVar22[3] = 0;
    }
    local_340._0_8_ = (ErrorResult *)0x0;
    this_00 = &deps[0x1c8].DisconnectAddrKey.impl_.data_.v6.sin6_addr;
    __ptr = *(HostnameResolverState **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8);
    *(undefined8 **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) = puVar22;
    if ((__ptr != (HostnameResolverState *)0x0) &&
       (std::default_delete<tonk::HostnameResolverState>::operator()
                  ((default_delete<tonk::HostnameResolverState> *)this_00,__ptr),
       (ErrorResult *)local_340._0_8_ != (ErrorResult *)0x0)) {
      std::default_delete<tonk::HostnameResolverState>::operator()
                ((default_delete<tonk::HostnameResolverState> *)local_340,
                 (HostnameResolverState *)local_340._0_8_);
    }
    puVar27 = *(uint16_t **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8);
    *puVar27 = in_stack_00000008;
    piVar4 = deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    this_01 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)
              operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (this_01 != (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0) {
      asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::basic_io_object
                (this_01,piVar4);
      puVar27 = *(uint16_t **)&this_00->__in6_u;
    }
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)(puVar27 + 4),(pointer)this_01);
    SecureRandom_Next((tonk *)local_340,local_360,8);
    uVar10 = local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar10;
    Result::~Result((Result *)local_340);
    if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
      deps[0x1cb].MappedPort = (MappedPortLifetime *)local_360._0_8_;
      initSubsystems((Connection *)local_340);
      uVar10 = local_340._0_8_;
      local_340._0_8_ = (ErrorResult *)0x0;
      (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar10;
      Result::~Result((Result *)local_340);
      if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
        SessionOutgoing::StartHandshakeC2SConnect
                  ((SessionOutgoing *)&deps[3].IdMap,(uint64_t)deps[0x1cb].MappedPort);
        resetTimers((Connection *)deps,
                    ((deps[2].SocketRefCount)->ShutdownLock).super___mutex_base._M_mutex.__data.
                    __owner,false);
        if ((InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
             ::kAnyProtocolStr_abi_cxx11_ == '\0') &&
           (iVar20 = __cxa_guard_acquire(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                          ::kAnyProtocolStr_abi_cxx11_), iVar20 != 0)) {
          InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
          ::kAnyProtocolStr_abi_cxx11_._M_dataplus._M_p =
               (pointer)&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                         ::kAnyProtocolStr_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                      ::kAnyProtocolStr_abi_cxx11_,"");
          __cxa_atexit(std::__cxx11::string::~string,
                       &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                        ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                               ::kAnyProtocolStr_abi_cxx11_);
        }
        LOCK();
        *(int *)&(deps->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(deps->Context).
                      super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
        plVar6 = *(long **)(*(long *)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) + 8);
        std::__cxx11::string::string
                  ((string *)local_340,(char *)CONCAT62(in_register_0000008a,serverPort),&local_399)
        ;
        local_380.this = (Connection *)deps;
        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                  ((basic_resolver_query<asio::ip::tcp> *)local_1b8,(string *)local_340,
                   &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                    ::kAnyProtocolStr_abi_cxx11_,0);
        local_378.h = &local_380;
        lVar7 = *plVar6;
        if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
          this_thread = (thread_info_base *)0x0;
        }
        else {
          this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
        }
        prVar24 = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                   *)asio::detail::thread_info_base::allocate(this_thread,0xc0);
        local_378.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        this_02 = (resolver_service_base *)(lVar7 + 0x28);
        peVar8 = (element_type *)plVar6[1];
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[2];
        if (p_Var9 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_390 = this_02->io_context_impl_;
          (prVar24->super_operation).next_ = (scheduler_operation *)0x0;
          (prVar24->super_operation).func_ =
               asio::detail::
               resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
               ::do_complete;
          (prVar24->super_operation).task_result_ = 0;
          (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar8;
          (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_weak_count = p_Var9->_M_weak_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_weak_count = p_Var9->_M_weak_count + 1;
          }
          local_390 = this_02->io_context_impl_;
          (prVar24->super_operation).next_ = (scheduler_operation *)0x0;
          (prVar24->super_operation).func_ =
               asio::detail::
               resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
               ::do_complete;
          (prVar24->super_operation).task_result_ = 0;
          (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar8;
          (prVar24->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var9;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_weak_count = p_Var9->_M_weak_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_weak_count = p_Var9->_M_weak_count + 1;
          }
        }
        local_398 = &prVar24->cancel_token_;
        *(ulong *)&(prVar24->query_).hints_.ai_addrlen = CONCAT71(local_1b8._17_7_,local_1b8[0x10]);
        (prVar24->query_).hints_.ai_addr = (sockaddr *)local_1b8._24_8_;
        (prVar24->query_).hints_.ai_canonname = (char *)pWStack_198;
        (prVar24->query_).hints_.ai_next = (addrinfo *)pWStack_190;
        (prVar24->query_).hints_.ai_flags = local_1b8._0_4_;
        (prVar24->query_).hints_.ai_family = local_1b8._4_4_;
        (prVar24->query_).hints_.ai_socktype = local_1b8._8_4_;
        (prVar24->query_).hints_.ai_protocol = local_1b8._12_4_;
        *(ulong *)&(prVar24->query_).hints_.ai_addrlen = CONCAT71(local_1b8._17_7_,local_1b8[0x10]);
        (prVar24->query_).hints_.ai_addr = (sockaddr *)local_1b8._24_8_;
        (prVar24->query_).host_name_._M_dataplus._M_p =
             (pointer)&(prVar24->query_).host_name_.field_2;
        local_378.v = prVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(prVar24->query_).host_name_,local_188._M_p,
                   local_188._M_p + (long)&local_180->Used);
        (prVar24->query_).service_name_._M_dataplus._M_p =
             (pointer)&(prVar24->query_).service_name_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(prVar24->query_).service_name_,local_178._16_8_,
                   (pointer)(local_178._16_8_ + (long)&local_160->Used));
        prVar24->io_context_impl_ = local_390;
        (prVar24->handler_).this = local_380.this;
        (prVar24->ec_)._M_value = 0;
        peVar25 = (error_category *)std::_V2::system_category();
        (prVar24->ec_)._M_cat = peVar25;
        prVar24->addrinfo_ = (addrinfo_type *)0x0;
        local_378.p = prVar24;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = &p_Var9->_M_weak_count;
            iVar20 = *p_Var2;
            *p_Var2 = *p_Var2 + -1;
            UNLOCK();
          }
          else {
            iVar20 = p_Var9->_M_weak_count;
            p_Var9->_M_weak_count = iVar20 + -1;
          }
          if (iVar20 == 1) {
            (*p_Var9->_vptr__Sp_counted_base[3])(p_Var9);
          }
        }
        asio::detail::resolver_service_base::start_resolve_op
                  (this_02,&(local_378.p)->super_operation);
        local_378.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        local_378.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        asio::detail::
        resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
        ::ptr::reset(&local_378);
        if ((WindowHeader *)local_178._16_8_ != (WindowHeader *)local_158) {
          operator_delete((void *)local_178._16_8_);
        }
        if ((WindowHeader *)local_188._M_p != (WindowHeader *)local_178) {
          operator_delete(local_188._M_p);
        }
        if ((ErrorResult *)local_340._0_8_ != (ErrorResult *)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_);
        }
        bVar19 = ConnectionIdMap::InsertAndAssignId
                           (deps[1].IdMap,(id_t *)&deps[0x1cb].Context,(IConnection *)deps);
        if (!bVar19 &&
            *(int *)&deps[2].Context.
                     super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi < 4) {
          poVar3 = (ostringstream *)(local_1b8 + 0x10);
          local_1b8._0_8_ =
               (local_388->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_1b8._8_4_ = 3;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)deps[2].NATPool,(long)deps[3].SocketRefCount);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Failed to insert new connection into map",0x28);
          pOVar26 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar26,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base((ios_base *)(local_158 + 0x20));
        }
        postNextTimer((Connection *)deps);
      }
    }
  }
  if ((this->super_IConnection)._vptr_IConnection != (_func_int **)0x0) {
    Result::ToJson_abi_cxx11_((string *)local_360,(Result *)this);
    if (*(int *)&deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi < 4) {
      poVar3 = (ostringstream *)(local_340 + 0x10);
      local_340._0_8_ =
           (local_388->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_340._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,(char *)deps[2].NATPool,(long)deps[3].SocketRefCount);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Connection::InitializeOutgoingConnection failed: ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,(char *)local_360._0_8_,local_360._8_8_);
      pOVar26 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar26,(LogStringBuffer *)local_340);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_2c0);
    }
    if ((MappedPortLifetime *)local_360._0_8_ != (MappedPortLifetime *)(local_360 + 0x10)) {
      operator_delete((void *)local_360._0_8_);
    }
    Shutdown((Connection *)deps);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::InitializeOutgoingConnection(
    const Dependencies& deps,
    const TonkSocketConfig* socketConfig,
    const TonkConnectionConfig& connectionConfig,
    const char* serverHostname,
    uint16_t serverPort)
{
    Result result;

    try
    {
        Deps = deps;
        SocketConfig = socketConfig;
        ConnectionConfig = connectionConfig;

        // Add reference to socket
        Deps.SocketRefCount->IncrementReferences();

        Logger.SetPrefix(GetConnectionLogPrefix(serverHostname, serverPort));

        AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Deps.Context);
        if (!AsioEventStrand)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        ResolverState = MakeUniqueNoThrow<HostnameResolverState>();
        ResolverState->ServerUDPPort = serverPort;
        ResolverState->Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Deps.Context);

#ifdef TONK_DISABLE_OUTGOING_ENCRYPTION
        EncryptionKey = 0;
#else // TONK_DISABLE_OUTGOING_ENCRYPTION
        uint8_t keyBytes[8];
        result = SecureRandom_Next(keyBytes, 8);
        if (result.IsFail()) {
            goto OnError;
        }
        EncryptionKey = siamese::ReadU64_LE(keyBytes);
#endif // TONK_DISABLE_OUTGOING_ENCRYPTION

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Start attaching handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(EncryptionKey);

        // Initialize timers for outgoing connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, false);

        //----------------------------------------------------------------------
        // Connection creation cannot fail past this point
        //----------------------------------------------------------------------

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        // Kick off async resolve after initialization
        SelfRefCount.IncrementReferences();
        ResolverState->Resolver->async_resolve(serverHostname, kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            onResolve(error, results);
            SelfRefCount.DecrementReferences();
        });

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("Failed to insert new connection into map");
        }

        postNextTimer();

        /*
            Do not immediately flush queued messages - The application decides
            when to flush the initial data so that it can be included in the
            first connection request datagram to the server.
        */
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::InitializeOutgoingConnection", "Exception!", ErrorType::Tonk);
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::InitializeOutgoingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}